

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Http.cpp
# Opt level: O1

bool __thiscall asl::HttpMessage::putFile(HttpMessage *this,String *path,int begin,int end)

{
  bool bVar1;
  int iVar2;
  Long LVar3;
  ULong UVar4;
  undefined4 in_register_0000000c;
  size_t sVar5;
  void *__buf;
  undefined8 uVar6;
  anon_union_16_2_78e7fdac_for_String_2 *paVar7;
  int iVar8;
  anon_union_16_2_78e7fdac_for_String_2 *paVar9;
  String head;
  String boundary;
  String s_2;
  String s_1;
  String s;
  File file;
  String local_168;
  String local_150;
  HttpMessage *local_138;
  String local_130;
  String local_118;
  String local_100;
  String local_e8;
  int local_cc;
  anon_union_16_2_78e7fdac_for_String_2 *local_c8;
  String local_c0;
  String local_a8;
  undefined1 local_90 [24];
  File local_78;
  
  sVar5 = CONCAT44(in_register_0000000c,end);
  local_138 = this;
  File::File(&local_78,path);
  local_78._info.size = -1;
  File::creationDate((File *)local_90);
  if (((double)CONCAT44(local_90._4_4_,local_90._0_4_) != 0.0) ||
     (NAN((double)CONCAT44(local_90._4_4_,local_90._0_4_)))) {
    if (end == 0 && begin == 0) {
      String::String((String *)local_90,"Content-Range");
      bVar1 = hasHeader(local_138,(String *)local_90);
      bVar1 = !bVar1;
      if (local_90._0_4_ != 0) {
        free((void *)local_90._8_8_);
      }
    }
    else {
      bVar1 = false;
    }
    if (bVar1) {
      String::String(&local_150,"Content-Length");
      LVar3 = File::size(&local_78);
      String::String(&local_168,LVar3);
      setHeader(local_138,&local_150,&local_168);
    }
    else {
      LVar3 = File::size(&local_78);
      if (end == 0) {
        end = (int)LVar3 - 1;
      }
      if ((begin < 0 || (end - begin == 0 || end < begin)) || LVar3 < end) {
        String::String(&local_150,"Content-Length");
        String::String(&local_168,"0");
        setHeader(local_138,&local_150,&local_168);
        if (local_168._size != 0) {
          free(local_168.field_2._str);
        }
        if (local_150._size != 0) {
          free((void *)CONCAT71(local_150.field_2._1_7_,local_150.field_2._space[0]));
        }
        String::String(&local_150,"Content-Range");
        String::f(&local_168,"bytes */%lli",LVar3);
        setHeader(local_138,&local_150,&local_168);
        if (local_168._size != 0) {
          free(local_168.field_2._str);
        }
        if (local_150._size != 0) {
          free((void *)CONCAT71(local_150.field_2._1_7_,local_150.field_2._space[0]));
        }
        goto LAB_00125363;
      }
      String::String(&local_150,"Content-Length");
      String::String(&local_168,(end - begin) + 1);
      setHeader(local_138,&local_150,&local_168);
      if (local_168._size != 0) {
        free(local_168.field_2._str);
      }
      if (local_150._size != 0) {
        free((void *)CONCAT71(local_150.field_2._1_7_,local_150.field_2._space[0]));
      }
      String::String(&local_150,"Content-Range");
      String::f(&local_168,"bytes %i-%i/%lli",(ulong)(uint)begin,(ulong)(uint)end,LVar3);
      setHeader(local_138,&local_150,&local_168);
    }
    if (local_168._size != 0) {
      free(local_168.field_2._str);
    }
    if (local_150._size != 0) {
      free((void *)CONCAT71(local_150.field_2._1_7_,local_150.field_2._space[0]));
    }
    String::String(&local_168,"Content-Type");
    header(&local_150,local_138,&local_168);
    local_c8 = &local_150.field_2;
    paVar9 = (anon_union_16_2_78e7fdac_for_String_2 *)
             CONCAT71(local_150.field_2._1_7_,local_150.field_2._space[0]);
    paVar7 = paVar9;
    if (local_150._size == 0) {
      paVar7 = local_c8;
    }
    iVar2 = strcmp(paVar7->_space,"multipart/form-data");
    if (local_150._size != 0) {
      free(paVar9);
    }
    if (local_168._size != 0) {
      free(local_168.field_2._str);
    }
    local_150.field_2._space[0] = '\0';
    local_150._size = 0;
    local_150._len = 0;
    if (iVar2 == 0) {
      local_cc = begin;
      String::assign(&local_150,"-----------",0xb);
      iVar8 = 0x40;
      do {
        UVar4 = Random::getLong((Random *)random);
        String::operator+=(&local_150,
                           (char)(int)((double)(UVar4 >> 0xb) * 1.1102230246251565e-15 + 48.0));
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      String::String(&local_a8,"--");
      begin = local_cc;
      paVar9 = &local_150.field_2;
      paVar7 = paVar9;
      if (local_150._size != 0) {
        paVar7 = (anon_union_16_2_78e7fdac_for_String_2 *)
                 CONCAT71(local_150.field_2._1_7_,local_150.field_2._space[0]);
      }
      String::append(&local_a8,paVar7->_space,local_150._len);
      String::concat(&local_e8,&local_a8,"\r\n",2);
      String::concat(&local_100,&local_e8,
                     "Content-Disposition: form-data; name=\"files\"; filename=\"",0x38);
      File::name(&local_c0,&local_78);
      uVar6 = local_c0.field_2._str;
      if (local_c0._size == 0) {
        uVar6 = &local_c0.field_2;
      }
      String::concat(&local_118,&local_100,(char *)uVar6,local_c0._len);
      String::concat(&local_130,&local_118,"\"\r\n",3);
      String::concat(&local_168,&local_130,"Content-Type: application/octet-stream\r\n\r\n",0x2a);
      if (local_130._size != 0) {
        free(local_130.field_2._str);
      }
      if (local_118._size != 0) {
        free(local_118.field_2._str);
      }
      if (local_c0._size != 0) {
        free(local_c0.field_2._str);
      }
      if (local_100._size != 0) {
        free(local_100.field_2._str);
      }
      if (local_e8._size != 0) {
        free(local_e8.field_2._str);
      }
      if (local_a8._size != 0) {
        free(local_a8.field_2._str);
      }
      String::String(&local_130,"Content-Length");
      String::String(&local_e8,"Content-Length");
      header(&local_100,local_138,&local_e8);
      uVar6 = local_100.field_2._str;
      if (local_100._size == 0) {
        uVar6 = &local_100.field_2;
      }
      iVar8 = myatoi((char *)uVar6);
      sVar5 = (size_t)(uint)local_150._len;
      String::String(&local_118,local_150._len + iVar8 + local_168._len + 8);
      setHeader(local_138,&local_130,&local_118);
      if (local_118._size != 0) {
        free(local_118.field_2._str);
      }
      if (local_100._size != 0) {
        free(local_100.field_2._str);
      }
      if (local_e8._size != 0) {
        free(local_e8.field_2._str);
      }
      if (local_130._size != 0) {
        free(local_130.field_2._str);
      }
      String::String(&local_130,"Content-Type");
      String::String(&local_118,"multipart/form-data; boundary=");
      if (local_150._size != 0) {
        paVar9 = (anon_union_16_2_78e7fdac_for_String_2 *)
                 CONCAT71(local_150.field_2._1_7_,local_150.field_2._space[0]);
      }
      String::append(&local_118,paVar9->_space,local_150._len);
      setHeader(local_138,&local_130,&local_118);
      if (local_118._size != 0) {
        free(local_118.field_2._str);
      }
      if (local_130._size != 0) {
        free(local_130.field_2._str);
      }
      if (local_168._size == 0) {
        iVar8 = (int)&local_168 + 8;
      }
      else {
        iVar8 = (int)local_168.field_2._str;
      }
      write(local_138,iVar8,(void *)(ulong)(uint)local_168._len,sVar5);
      if (local_168._size != 0) {
        free(local_168.field_2._str);
      }
    }
    writeFile(local_138,path,begin,end);
    if (iVar2 == 0) {
      String::String(&local_130,"\r\n--");
      if (local_150._size != 0) {
        local_c8 = (anon_union_16_2_78e7fdac_for_String_2 *)
                   CONCAT71(local_150.field_2._1_7_,local_150.field_2._space[0]);
      }
      String::append(&local_130,local_c8->_space,local_150._len);
      sVar5 = 4;
      String::concat(&local_168,&local_130,"--\r\n",4);
      if (local_168._size == 0) {
        iVar2 = (int)&local_168 + 8;
      }
      else {
        iVar2 = (int)local_168.field_2._str;
      }
      write(local_138,iVar2,(void *)(ulong)(uint)local_168._len,sVar5);
      if (local_168._size != 0) {
        free(local_168.field_2._str);
      }
      if (local_130._size != 0) {
        free(local_130.field_2._str);
      }
    }
    if (local_150._size != 0) {
      free((void *)CONCAT71(local_150.field_2._1_7_,local_150.field_2._space[0]));
    }
    bVar1 = true;
  }
  else {
    if (path->_size == 0) {
      paVar9 = &path->field_2;
    }
    else {
      paVar9 = (anon_union_16_2_78e7fdac_for_String_2 *)(path->field_2)._str;
    }
    printf("file to upload not found %s\n",paVar9);
    iVar2 = 0x1431d4;
    put(local_138,"");
    write(local_138,iVar2,__buf,sVar5);
LAB_00125363:
    bVar1 = false;
  }
  File::~File(&local_78);
  return bVar1;
}

Assistant:

bool HttpMessage::putFile(const String& path, int begin, int end)
{
	File file(path);
	if (!file.exists())
	{
		printf("file to upload not found %s\n", *path);
		put("");
		write();
		return false;
	}
	if (begin == 0 && end == 0 && !hasHeader("Content-Range"))
		setHeader("Content-Length", file.size());
	else
	{
		Long size = file.size();
		if (end == 0)
			end = int(size - 1);
		if (end <= begin || begin < 0 || end > size)
		{
			setHeader("Content-Length", "0");
			setHeader("Content-Range", String::f("bytes */%lli", size));
			return false;
		}
		setHeader("Content-Length", end - begin + 1);
		setHeader("Content-Range", String::f("bytes %i-%i/%lli", begin, end, size));
	}

	bool multipart = header("Content-Type") == "multipart/form-data";

	String boundary;

	if (multipart)
	{
		boundary = "-----------";
		for (int i = 0; i < 64; i++)
			boundary += (char)random('0', '9');

		String head = "--" + boundary + "\r\n" +
			"Content-Disposition: form-data; name=\"files\"; filename=\"" + file.name() + "\"\r\n" +
			"Content-Type: application/octet-stream\r\n\r\n";

		setHeader("Content-Length", int(header("Content-Length")) + head.length() + boundary.length() + 8);
		setHeader("Content-Type", "multipart/form-data; boundary=" + boundary);

		write(head);
	}
	writeFile(path, begin, end);
	
	if (multipart)
	{
		write("\r\n--" + boundary + "--\r\n");
	}

	return true;
}